

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

void nn_random_seed(void)

{
  __pid_t _Var1;
  uint64_t uVar2;
  uint64_t pid;
  
  _Var1 = getpid();
  nn_random_state._0_1_ = -6;
  nn_random_state._1_1_ = -0x65;
  nn_random_state._2_1_ = '#';
  nn_random_state._3_1_ = -0x1d;
  nn_random_state._4_1_ = '\a';
  nn_random_state._5_1_ = -0x34;
  nn_random_state._6_1_ = 'a';
  nn_random_state._7_1_ = '\x1f';
  uVar2 = nn_clock_ms();
  nn_random_state = (long)_Var1 + uVar2 ^ nn_random_state;
  return;
}

Assistant:

void nn_random_seed ()
{
    uint64_t pid;

#ifdef NN_HAVE_WINDOWS
    pid = (uint64_t) GetCurrentProcessId ();
#else
    pid = (uint64_t) getpid ();
#endif

    /*  The initial state for pseudo-random number generator is computed from
        the exact timestamp and process ID. */
    memcpy (&nn_random_state, "\xfa\x9b\x23\xe3\x07\xcc\x61\x1f", 8);
    nn_random_state ^= pid + nn_clock_ms();
}